

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O3

void comparison(Vm *vm)

{
  Compiler *pCVar1;
  Token *pTVar2;
  Token *pTVar3;
  char *pcVar4;
  size_t sVar5;
  uint32_t uVar6;
  undefined4 uVar7;
  TokenType TVar8;
  undefined4 uVar9;
  Vm *pVVar10;
  uint uVar11;
  Scanner *scanner;
  Token local_60;
  Scanner *local_40;
  Vm *local_38;
  
  arith_expr(vm);
  pCVar1 = &vm->compiler;
  pTVar2 = &(vm->compiler).previous;
  pTVar3 = &(vm->compiler).next;
  scanner = &(vm->compiler).scanner;
  local_40 = scanner;
  local_38 = vm;
LAB_00105cbf:
  switch((pCVar1->token).type) {
  case TOKEN_SMALLER:
  case TOKEN_GREATER:
  case TOKEN_SMALLER_EQUALS:
  case TOKEN_GREATER_EQUALS:
    break;
  default:
    return;
  }
  TVar8 = (pCVar1->token).type;
  uVar9 = *(undefined4 *)&(pCVar1->token).field_0x4;
  pcVar4 = (vm->compiler).token.start;
  uVar6 = (vm->compiler).token.line;
  uVar7 = *(undefined4 *)&(vm->compiler).token.field_0x1c;
  (vm->compiler).previous.length = (vm->compiler).token.length;
  (vm->compiler).previous.line = uVar6;
  *(undefined4 *)&(vm->compiler).previous.field_0x1c = uVar7;
  pTVar2->type = TVar8;
  *(undefined4 *)&pTVar2->field_0x4 = uVar9;
  (vm->compiler).previous.start = pcVar4;
  uVar7 = *(undefined4 *)&pTVar3->field_0x4;
  pcVar4 = (vm->compiler).next.start;
  sVar5 = (vm->compiler).next.length;
  uVar6 = (vm->compiler).next.line;
  uVar9 = *(undefined4 *)&(vm->compiler).next.field_0x1c;
  (pCVar1->token).type = pTVar3->type;
  *(undefined4 *)&(pCVar1->token).field_0x4 = uVar7;
  (vm->compiler).token.start = pcVar4;
  (vm->compiler).token.length = sVar5;
  (vm->compiler).token.line = uVar6;
  *(undefined4 *)&(vm->compiler).token.field_0x1c = uVar9;
  scan_token(&local_60,scanner);
  pVVar10 = local_38;
  (vm->compiler).next.length = local_60.length;
  (vm->compiler).next.line = local_60.line;
  *(undefined4 *)&(vm->compiler).next.field_0x1c = local_60._28_4_;
  pTVar3->type = local_60.type;
  *(undefined4 *)&pTVar3->field_0x4 = local_60._4_4_;
  (vm->compiler).next.start = local_60.start;
  uVar11 = pTVar2->type - TOKEN_SMALLER;
  if (uVar11 < 4) {
    arith_expr(local_38);
    scanner = local_40;
    write_code_buffer(&(pVVar10->frames).frame_pointers[pVVar10->frame_count - 1]->code_buffer,
                      (uint8_t)(0x10110e0f >> ((char)uVar11 * '\b' & 0x1fU)));
  }
  goto LAB_00105cbf;
}

Assistant:

static void comparison(Vm *vm) {
    arith_expr(vm);

    while (match(vm, TOKEN_SMALLER) || match(vm, TOKEN_SMALLER_EQUALS)
           || match(vm, TOKEN_GREATER) || match(vm, TOKEN_GREATER_EQUALS)) {
        switch (vm->compiler.previous.type) {
            case TOKEN_SMALLER:
                arith_expr(vm);
                emit_no_arg(vm, OP_LT);
                break;
            case TOKEN_SMALLER_EQUALS:
                arith_expr(vm);
                emit_no_arg(vm, OP_LE);
                break;
            case TOKEN_GREATER:
                arith_expr(vm);
                emit_no_arg(vm, OP_GT);
                break;
            case TOKEN_GREATER_EQUALS:
                arith_expr(vm);
                emit_no_arg(vm, OP_GE);
                break;
            default:
                break;
        }
    }
}